

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter-mip-test.h
# Opt level: O2

void __thiscall
mip_converter_test::MIPInstance::Objective::Objective(Objective *this,Objective *param_1)

{
  this->sense_ = param_1->sense_;
  SparseVec::SparseVec(&this->le_,&param_1->le_);
  return;
}

Assistant:

bool operator==(const Objective& obj) const {
      bool eq1 = sense_==obj.sense_;
      bool eq2 = le_==obj.le_;
      if (!eq1)
        printf("Diff sense\n");
      if (!eq2) {
        printf("Diff coefs\n");
        for (size_t i=0; i<le_.size(); ++i) {
          printf(" %d:%f", le_.v_[i], le_.c_[i]);
        }
        printf("\n");
        for (size_t i=0; i<obj.le_.size(); ++i) {
          printf(" %d:%f", obj.le_.v_[i], obj.le_.c_[i]);
        }
        printf("\n");
      }
      return eq1 && eq2;
    }